

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_algs.cc
# Opt level: O2

void CB_ALGS::predict_eval(cb *param_1,single_learner *param_2,example *param_3)

{
  vw_exception *this;
  string local_1c0;
  stringstream __msg;
  ostream local_190;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
  std::operator<<(&local_190,"can not use a test label for evaluation");
  this = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  VW::vw_exception::vw_exception
            (this,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/cb_algs.cc"
             ,0x46,&local_1c0);
  __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

void predict_eval(cb&, single_learner&, example&) { THROW("can not use a test label for evaluation"); }